

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileAction.cpp
# Opt level: O3

void __thiscall QFileActionPrivate::~QFileActionPrivate(QFileActionPrivate *this)

{
  *(undefined ***)this = &PTR_metaObject_001aab88;
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->filter).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->directory).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->caption).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->filePath).d);
  QObject::~QObject(&this->super_QObject);
  operator_delete(this,0x88);
  return;
}

Assistant:

class QFileActionPrivate : public QObject {
    Q_OBJECT

public:
    explicit QFileActionPrivate(QFileAction *actionP)
        : QObject(actionP)
        , action(actionP)
        , type(QFileAction::Type::OpenFile)
        , options() {
        Q_ASSERT(action);

        updateIcon();

        connect(action, &QAction::triggered, this, &QFileActionPrivate::triggered);
    }

    void updateIcon() {
        switch (type) {
        case QFileAction::Type::OpenFile:
            action->setIcon(qApp->style()->standardIcon(QStyle::SP_DialogOpenButton));
            break;
        case QFileAction::Type::SaveFile:
            action->setIcon(qApp->style()->standardIcon(QStyle::SP_DialogSaveButton));
            break;
        case QFileAction::Type::OpenFolder:
            action->setIcon(qApp->style()->standardIcon(QStyle::SP_DirIcon));
            break;
        }
    }